

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int eval_preprocessor_boolean(char *z,int lineno)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  long lVar4;
  char **ppcVar5;
  int iVar6;
  ushort **ppuVar7;
  long lVar8;
  char *extraout_RAX;
  long lVar9;
  char *__src;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  byte *local_60;
  
  bVar1 = *z;
  if (bVar1 == 0) {
    return 0;
  }
  ppuVar7 = __ctype_b_loc();
  uVar19 = 1;
  uVar20 = 0;
  uVar12 = 0;
  uVar10 = 0;
  local_60 = (byte *)z;
  do {
    ppcVar5 = azDefine;
    iVar15 = (int)uVar20;
    uVar3 = (*ppuVar7)[bVar1];
    uVar17 = (uint)uVar10;
    if ((uVar3 >> 0xd & 1) == 0) {
      if (bVar1 < 0x28) {
        if (bVar1 == 0x21) {
          if (uVar19 == 0) goto LAB_0010c6f8;
          uVar17 = (uint)(uVar17 == 0);
          uVar19 = 1;
        }
        else {
          if ((bVar1 != 0x26) || (z[(long)iVar15 + 1] != '&')) goto LAB_0010c555;
          if (uVar19 != 0) goto LAB_0010c6f8;
          if (uVar12 == 0) {
            return 0;
          }
LAB_0010c54a:
          iVar15 = iVar15 + 1;
          uVar19 = 1;
        }
      }
      else if (bVar1 == 0x28) {
        if (uVar19 == 0) goto LAB_0010c6f8;
        iVar11 = iVar15 + 1;
        pcVar18 = z + iVar11;
        uVar19 = 1;
        iVar13 = iVar11;
LAB_0010c645:
        cVar2 = *pcVar18;
        if (cVar2 == '(') {
          uVar19 = uVar19 + 1;
LAB_0010c661:
          pcVar18 = pcVar18 + 1;
          iVar13 = iVar13 + 1;
          goto LAB_0010c645;
        }
        if (cVar2 != ')') {
          iVar6 = iVar15;
          if (cVar2 == '\0') goto LAB_0010c695;
          goto LAB_0010c661;
        }
        uVar19 = uVar19 - 1;
        if (uVar19 != 0) goto LAB_0010c661;
        *pcVar18 = '\0';
        uVar12 = eval_preprocessor_boolean(z + iVar11,-1);
        *pcVar18 = ')';
        iVar6 = iVar13;
        if ((int)uVar12 < 0) {
          uVar20 = (ulong)(iVar15 - uVar12);
          goto LAB_0010c6f8;
        }
LAB_0010c695:
        iVar15 = iVar6;
        if (uVar17 != 0) {
          uVar12 = (uint)(uVar12 == 0);
        }
        uVar17 = 0;
        uVar19 = 0;
      }
      else {
        if ((bVar1 == 0x7c) && (z[(long)iVar15 + 1] == '|')) {
          if (uVar19 != 0) goto LAB_0010c6f8;
          if (uVar12 != 0) {
            return 1;
          }
          uVar12 = 0;
          goto LAB_0010c54a;
        }
LAB_0010c555:
        if (((uVar3 >> 10 & 1) == 0) || (uVar19 == 0)) {
LAB_0010c6f8:
          uVar16 = (ulong)(uint)lineno;
          if (0 < lineno) {
            piVar14 = (int *)(uVar20 & 0xffffffff);
            eval_preprocessor_boolean_cold_1();
            uVar20 = uVar10 & 0xffffffff;
            uVar12 = (uint)uVar10;
            pcVar18 = extraout_RAX;
            if ((int)uVar19 < 0) {
              uVar19 = 0xffffffff;
              pcVar18 = __src;
              do {
                uVar19 = uVar19 + 1;
                cVar2 = *pcVar18;
                pcVar18 = pcVar18 + 1;
              } while (cVar2 != '\0');
            }
            iVar15 = (int)pcVar18;
            uVar17 = uVar12;
            while ((int)uVar19 < (int)uVar12) {
              iVar15 = *piVar14;
              *piVar14 = iVar15 + 1;
              *(undefined1 *)(uVar16 + (long)iVar15) = 0x20;
              uVar12 = (int)uVar20 - 1;
              uVar20 = (ulong)uVar12;
              uVar17 = uVar19;
            }
            if (uVar19 != 0) {
              memcpy((void *)((long)*piVar14 + uVar16),__src,(ulong)uVar19);
              iVar15 = *piVar14 + uVar19;
              *piVar14 = iVar15;
              iVar13 = -uVar17;
              if (SBORROW4(uVar19,iVar13) != (int)(uVar19 + uVar17) < 0) {
                do {
                  iVar15 = *piVar14;
                  *piVar14 = iVar15 + 1;
                  *(undefined1 *)(uVar16 + (long)iVar15) = 0x20;
                  iVar13 = iVar13 + -1;
                } while ((int)uVar19 < iVar13);
                iVar15 = *piVar14;
              }
              *(undefined1 *)(uVar16 + (long)iVar15) = 0;
            }
            return iVar15;
          }
          return ~(uint)uVar20;
        }
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + -1;
        lVar8 = 0;
        do {
          do {
            lVar4 = lVar8 + lVar9 + 1;
            iVar15 = iVar15 + 1;
            lVar8 = lVar8 + 1;
          } while (z[lVar4] == 0x5f);
        } while (((*ppuVar7)[(byte)z[lVar4]] & 8) != 0);
        uVar10 = (ulong)nDefine;
        if ((long)uVar10 < 1) {
          uVar12 = 1;
          uVar19 = 0;
        }
        else {
          uVar12 = 0;
          uVar20 = 1;
          do {
            pcVar18 = ppcVar5[uVar20 - 1];
            iVar13 = strncmp(pcVar18,(char *)local_60,(long)(int)lVar8);
            if ((iVar13 == 0) && (pcVar18[(int)lVar8] == '\0')) {
              uVar19 = 1;
              goto LAB_0010c6c8;
            }
            uVar12 = (uint)(uVar10 <= uVar20);
            bVar21 = uVar20 != uVar10;
            uVar20 = uVar20 + 1;
          } while (bVar21);
          uVar19 = 0;
        }
LAB_0010c6c8:
        if (uVar17 == 0) {
          uVar12 = uVar19;
        }
        uVar19 = 0;
        uVar17 = 0;
      }
    }
    local_60 = (byte *)(z + (long)iVar15 + 1);
    uVar20 = (long)iVar15 + 1;
    bVar1 = *local_60;
    uVar10 = (ulong)uVar17;
    if (bVar1 == 0) {
      return uVar12;
    }
  } while( true );
}

Assistant:

static int eval_preprocessor_boolean(char *z, int lineno){
  int neg = 0;
  int res = 0;
  int okTerm = 1;
  int i;
  for(i=0; z[i]!=0; i++){
    if( ISSPACE(z[i]) ) continue;
    if( z[i]=='!' ){
      if( !okTerm ) goto pp_syntax_error;
      neg = !neg;
      continue;
    }
    if( z[i]=='|' && z[i+1]=='|' ){
      if( okTerm ) goto pp_syntax_error;
      if( res ) return 1;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='&' && z[i+1]=='&' ){
      if( okTerm ) goto pp_syntax_error;
      if( !res ) return 0;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='(' ){
      int k;
      int n = 1;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; z[k]; k++){
        if( z[k]==')' ){
          n--;
          if( n==0 ){
            z[k] = 0;
            res = eval_preprocessor_boolean(&z[i+1], -1);
            z[k] = ')';
            if( res<0 ){
              i = i-res;
              goto pp_syntax_error;
            }
            i = k;
            break;
          }
        }else if( z[k]=='(' ){
          n++;
        }else if( z[k]==0 ){
          i = k;
          goto pp_syntax_error;
        }
      }
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    if( ISALPHA(z[i]) ){
      int j, k, n;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; ISALNUM(z[k]) || z[k]=='_'; k++){}
      n = k - i;
      res = 0;
      for(j=0; j<nDefine; j++){
        if( strncmp(azDefine[j],&z[i],n)==0 && azDefine[j][n]==0 ){
          res = 1;
          break;
        }
      }
      i = k-1;
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    goto pp_syntax_error;
  }
  return res;

pp_syntax_error:
  if( lineno>0 ){
    fprintf(stderr, "%%if syntax error on line %d.\n", lineno);
    fprintf(stderr, "  %.*s <-- syntax error here\n", i+1, z);
    exit(1);
  }else{
    return -(i+1);
  }
}